

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

void PDHG_Compute_Average_Iterate(CUPDLPwork *work)

{
  int *piVar1;
  undefined8 *in_RDI;
  CUPDLPwork *x;
  double dVar2;
  cupdlp_float dDualScale;
  cupdlp_float dPrimalScale;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *stepsize;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  cupdlp_int n;
  double weight;
  CUPDLPwork *w;
  CUPDLPvec *ax;
  CUPDLPwork *w_00;
  
  piVar1 = *(int **)*in_RDI;
  w_00 = (CUPDLPwork *)in_RDI[4];
  ax = (CUPDLPvec *)in_RDI[3];
  if ((double)w_00->iterates <= 0.0) {
    x = (CUPDLPwork *)0x3ff0000000000000;
  }
  else {
    x = (CUPDLPwork *)(1.0 / (double)w_00->iterates);
  }
  if ((double)w_00->stepsize <= 0.0) {
    dVar2 = 1.0;
  }
  else {
    dVar2 = 1.0 / (double)w_00->stepsize;
  }
  weight = dVar2;
  w = x;
  memcpy(*(void **)(*(long *)(ax + 8) + 8),*(void **)(ax + 2),(long)piVar1[1] << 3);
  memcpy((void *)ax[8].data[1],ax[2].data,(long)*piVar1 << 3);
  n = (cupdlp_int)((ulong)dVar2 >> 0x20);
  cupdlp_scaleVector(w,weight,(cupdlp_float *)x,n);
  cupdlp_scaleVector(w,weight,(cupdlp_float *)x,n);
  Ax(w_00,ax,(CUPDLPvec *)w);
  ATy(w_00,ax,(CUPDLPvec *)w);
  return;
}

Assistant:

void PDHG_Compute_Average_Iterate(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;

  cupdlp_float dPrimalScale =
      stepsize->dSumPrimalStep > 0.0 ? 1.0 / stepsize->dSumPrimalStep : 1.0;
  cupdlp_float dDualScale =
      stepsize->dSumDualStep > 0.0 ? 1.0 / stepsize->dSumDualStep : 1.0;

  // cupdlp_scaleVector(iterates->xAverage, iterates->xSum, dPrimalScale,
  // lp->nCols); cupdlp_scaleVector(iterates->yAverage, iterates->ySum,
  // dDualScale, lp->nRows);

  CUPDLP_COPY_VEC(iterates->xAverage->data, iterates->xSum, cupdlp_float,
                  lp->nCols);
  CUPDLP_COPY_VEC(iterates->yAverage->data, iterates->ySum, cupdlp_float,
                  lp->nRows);
  cupdlp_scaleVector(work, dPrimalScale, iterates->xAverage->data, lp->nCols);
  cupdlp_scaleVector(work, dDualScale, iterates->yAverage->data, lp->nRows);

  // Ax(work, iterates->axAverage, iterates->xAverage);
  // ATyCPU(work, iterates->atyAverage, iterates->yAverage);
  Ax(work, iterates->axAverage, iterates->xAverage);
  ATy(work, iterates->atyAverage, iterates->yAverage);
}